

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineRenderingCreateInfoKHR *create_info,ScratchAllocator *alloc,
          VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkPipelineRenderingCreateInfo *pVVar1;
  VkFormat *pVVar2;
  bool format_sensitive;
  bool view_mask_sensitive;
  VkPipelineRenderingCreateInfo *rendering;
  VkGraphicsPipelineLibraryFlagsEXT state_flags_local;
  ScratchAllocator *alloc_local;
  VkPipelineRenderingCreateInfoKHR *create_info_local;
  Impl *this_local;
  
  pVVar1 = copy<VkPipelineRenderingCreateInfo>(this,create_info,1,alloc);
  if ((state_flags & 8) == 0) {
    pVVar1->colorAttachmentCount = 0;
    pVVar1->pColorAttachmentFormats = (VkFormat *)0x0;
    pVVar1->depthAttachmentFormat = VK_FORMAT_UNDEFINED;
    pVVar1->stencilAttachmentFormat = VK_FORMAT_UNDEFINED;
    if ((state_flags & 0xe) == 0) {
      pVVar1->viewMask = 0;
    }
  }
  else {
    pVVar2 = copy<VkFormat>(this,pVVar1->pColorAttachmentFormats,(ulong)pVVar1->colorAttachmentCount
                            ,alloc);
    pVVar1->pColorAttachmentFormats = pVVar2;
  }
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineRenderingCreateInfoKHR *create_info,
                                             ScratchAllocator &alloc,
                                             VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	auto *rendering = copy(create_info, 1, alloc);

	bool view_mask_sensitive = (state_flags & (VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT |
	                                           VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT |
	                                           VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT)) != 0;
	bool format_sensitive = (state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT) != 0;

	if (format_sensitive)
	{
		rendering->pColorAttachmentFormats =
				copy(rendering->pColorAttachmentFormats, rendering->colorAttachmentCount, alloc);
	}
	else
	{
		rendering->colorAttachmentCount = 0;
		rendering->pColorAttachmentFormats = nullptr;
		rendering->depthAttachmentFormat = VK_FORMAT_UNDEFINED;
		rendering->stencilAttachmentFormat = VK_FORMAT_UNDEFINED;
		if (!view_mask_sensitive)
			rendering->viewMask = 0;
	}

	return rendering;
}